

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzD::ArchiveIN(ChNodeFEAxyzD *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChNodeFEAxyzD *)
            ((long)&(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase +
            (long)(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[-0x18]),in_RSI)
  ;
  return;
}

Assistant:

void ChNodeFEAxyzD::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeFEAxyzD>();
    // deserialize parent class
    ChNodeFEAxyz::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(D);
    marchive >> CHNVP(D_dt);
    marchive >> CHNVP(D_dtdt);
}